

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  pointer pfVar1;
  pointer pgVar2;
  conv_layer_t *this;
  layer_t *this_00;
  pool_layer_t *this_01;
  fc_layer_t *this_02;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  vector<layer_t_*,_std::allocator<layer_t_*>_> layers;
  tensor_t<float> image_tensor;
  vector<case_t,_std::allocator<case_t>_> cases;
  vector<layer_t_*,_std::allocator<layer_t_*>_> local_c8;
  float local_ac;
  tensor_t<float> local_a8;
  vector<case_t,_std::allocator<case_t>_> local_80;
  vector<layer_t_*,_std::allocator<layer_t_*>_> local_68;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading test cases.",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  readTrainingData();
  local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.super__Vector_impl_data
  ._M_finish = (layer_t **)0x0;
  local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (layer_t **)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Creating layers.",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  this = (conv_layer_t *)operator_new(0xb0);
  conv_layer_t::conv_layer_t
            (this,1,5,8,
             ((local_80.super__Vector_base<case_t,_std::allocator<case_t>_>._M_impl.
               super__Vector_impl_data._M_start)->data).size);
  this_00 = (layer_t *)operator_new(0x7c);
  relu_layer_t::relu_layer_t((relu_layer_t *)this_00,(this->super_layer_t).out.size);
  this_01 = (pool_layer_t *)operator_new(0x80);
  pool_layer_t::pool_layer_t(this_01,2,2,(this_00->out).size);
  this_02 = (fc_layer_t *)operator_new(0xd4);
  fc_layer_t::fc_layer_t(this_02,(this_01->super_layer_t).out.size,10);
  if (local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)this;
    std::vector<layer_t*,std::allocator<layer_t*>>::_M_realloc_insert<layer_t*>
              ((vector<layer_t*,std::allocator<layer_t*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(layer_t **)&local_a8);
  }
  else {
    *local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (layer_t *)this;
    local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if (local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)this_00;
    std::vector<layer_t*,std::allocator<layer_t*>>::_M_realloc_insert<layer_t*>
              ((vector<layer_t*,std::allocator<layer_t*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(layer_t **)&local_a8);
  }
  else {
    *local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
     super__Vector_impl_data._M_finish = this_00;
    local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if (local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)this_01;
    std::vector<layer_t*,std::allocator<layer_t*>>::_M_realloc_insert<layer_t*>
              ((vector<layer_t*,std::allocator<layer_t*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(layer_t **)&local_a8);
  }
  else {
    *local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (layer_t *)this_01;
    local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)this_02;
  if (local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<layer_t*,std::allocator<layer_t*>>::_M_realloc_insert<layer_t*>
              ((vector<layer_t*,std::allocator<layer_t*>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(layer_t **)&local_a8);
  }
  else {
    *local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (layer_t *)this_02;
    local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  local_ac = trainCNN(&local_c8,&local_80);
  lVar4 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Training completed.\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Time (baseline): ",0x13);
  poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) * 1e-09);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," s.\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Total error: ",0xf);
  poVar5 = std::ostream::_M_insert<double>((double)local_ac);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"../test.ppm","");
  loadImageAsTensor(&local_a8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  forward(&local_c8,&local_a8);
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::vector(&local_68,&local_c8);
  printResult(&local_68);
  if (local_68.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<tensor_t<gradient_t>,_std::allocator<tensor_t<gradient_t>_>_>::~vector
            (&this->filter_grads);
  std::vector<tensor_t<float>,_std::allocator<tensor_t<float>_>_>::~vector(&this->filters);
  pfVar1 = (this->super_layer_t).out.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this->super_layer_t).in.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  operator_delete(this);
  pfVar1 = (this_00->out).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this_00->in).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this_00->grads_in).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  operator_delete(this_00);
  pfVar1 = (this_01->super_layer_t).out.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this_01->super_layer_t).in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this_01->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  operator_delete(this_01);
  pgVar2 = (this_02->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pgVar2 != (pointer)0x0) {
    operator_delete(pgVar2);
  }
  pfVar1 = (this_02->weights).data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this_02->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this_02->super_layer_t).out.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this_02->super_layer_t).in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this_02->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  operator_delete(this_02);
  if ((fc_layer_t *)
      local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (fc_layer_t *)0x0) {
    operator_delete(local_a8.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<case_t,_std::allocator<case_t>_>::~vector(&local_80);
  return 0;
}

Assistant:

int main() {
  Timer t;

  /* Training phase */
  std::cout << "Reading test cases." << std::endl;
  std::vector<case_t> cases = readTrainingData();

  std::vector<layer_t *> layers;

  // The following layers make up the CNN in sequence.
  std::cout << "Creating layers." << std::endl;
  auto layer1 = new conv_layer_t(1, 5, 8, cases[0].data.size);
  auto layer2 = new relu_layer_t(layer1->out.size);
  auto layer3 = new pool_layer_t(2, 2, layer2->out.size);
  auto layer4 = new fc_layer_t(layer3->out.size, 10);

  // Push the layers into a vector of layers.
  layers.push_back(layer1);
  layers.push_back(layer2);
  layers.push_back(layer3);
  layers.push_back(layer4);

  // Train the CNN
  t.start();
  auto total_error = trainCNN(layers, cases);
  t.stop();
  std::cout << "Training completed.\n";
  std::cout << "  Time (baseline): " << t.seconds() << " s.\n";
  std::cout << "  Total error: " << total_error << std::endl;

  /* Test inference */
  // Load the test image
  auto image_tensor = loadImageAsTensor("../test.ppm");

  // Infer the CNN with the result image
  forward(layers, image_tensor);

  printResult(layers);

  delete layer1;
  delete layer2;
  delete layer3;
  delete layer4;

  return 0;

}